

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crossover.cc
# Opt level: O0

void __thiscall
ipx::Crossover::PushAll
          (Crossover *this,Basis *basis,Vector *x,Vector *y,Vector *z,double *weights,Info *info)

{
  pointer piVar1;
  double dVar2;
  bool bVar3;
  uint uVar4;
  ostream *poVar5;
  Info *info_00;
  Basis *basis_00;
  Vector *pVVar6;
  reference pvVar7;
  size_type sVar8;
  double *pdVar9;
  Vector *pVVar10;
  Model *model_00;
  valarray<double> *in_RDX;
  Basis *in_RSI;
  undefined8 *in_RDI;
  valarray<double> *in_R8;
  Control *this_00;
  double in_stack_00000008;
  Int j_1;
  size_t p_1;
  vector<int,_std::allocator<int>_> primal_superbasics;
  vector<int,_std::allocator<int>_> *in_stack_00000208;
  Vector *in_stack_00000210;
  Basis *in_stack_00000218;
  Crossover *in_stack_00000220;
  Int j;
  size_t p;
  vector<int,_std::allocator<int>_> dual_superbasics;
  stringstream h_logging_stream;
  vector<int,_std::allocator<int>_> perm;
  Vector *ub;
  Vector *lb;
  Int n;
  Int m;
  Model *model;
  double in_stack_fffffffffffffb08;
  double d;
  Basis *in_stack_fffffffffffffb10;
  value_type_conflict2 *in_stack_fffffffffffffb18;
  ostream *in_stack_fffffffffffffb20;
  Vector *in_stack_fffffffffffffb48;
  Model *in_stack_fffffffffffffb50;
  Vector *in_stack_fffffffffffffb58;
  Model *in_stack_fffffffffffffb60;
  Model *model_01;
  undefined8 in_stack_fffffffffffffb78;
  undefined1 reverse;
  undefined7 in_stack_fffffffffffffb80;
  undefined1 in_stack_fffffffffffffb87;
  undefined8 in_stack_fffffffffffffb88;
  Int m_00;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffbe0;
  undefined7 in_stack_fffffffffffffbe8;
  undefined1 in_stack_fffffffffffffbef;
  string local_3b8 [32];
  string local_398 [32];
  string local_378 [32];
  char (*in_stack_fffffffffffffca8) [35];
  string local_338 [36];
  int local_314;
  size_type local_310;
  vector<int,_std::allocator<int>_> local_308;
  uint local_2ec;
  string local_2e8 [36];
  int local_2c4;
  Vector *local_2c0;
  vector<int,_std::allocator<int>_> local_2b8;
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [48];
  stringstream local_1f0 [16];
  undefined1 local_1e0 [400];
  Vector *local_50;
  Vector *local_48;
  Int local_40;
  Int local_3c;
  Model *local_38;
  valarray<double> *local_28;
  valarray<double> *local_18;
  
  m_00 = (Int)((ulong)in_stack_fffffffffffffb88 >> 0x20);
  reverse = (undefined1)((ulong)in_stack_fffffffffffffb78 >> 0x38);
  local_28 = in_R8;
  local_18 = in_RDX;
  local_38 = Basis::model(in_RSI);
  local_3c = Model::rows(local_38);
  local_40 = Model::cols(local_38);
  local_48 = Model::lb(local_38);
  local_50 = Model::ub(local_38);
  Sortperm(m_00,(double *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
           (bool)reverse);
  std::__cxx11::stringstream::stringstream(local_1f0);
  std::__cxx11::string::string(local_220);
  std::__cxx11::stringstream::str((string *)local_1f0);
  std::__cxx11::string::~string(local_220);
  Textline<char[35]>(in_stack_fffffffffffffca8);
  poVar5 = std::operator<<((ostream *)local_1e0,local_240);
  PrimalResidual(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
  sci2_abi_cxx11_(in_stack_fffffffffffffb08);
  poVar5 = std::operator<<(poVar5,local_260);
  info_00 = (Info *)std::operator<<(poVar5,'\n');
  Textline<char[33]>((char (*) [33])in_stack_fffffffffffffca8);
  poVar5 = std::operator<<((ostream *)info_00,local_280);
  this_00 = (Control *)
            DualResidual(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
                         (Vector *)in_stack_fffffffffffffb50);
  sci2_abi_cxx11_(in_stack_fffffffffffffb08);
  basis_00 = (Basis *)std::operator<<(poVar5,local_2a0);
  std::operator<<((ostream *)basis_00,'\n');
  std::__cxx11::string::~string(local_2a0);
  std::__cxx11::string::~string(local_280);
  std::__cxx11::string::~string(local_260);
  std::__cxx11::string::~string(local_240);
  Control::hLog(this_00,(stringstream *)basis_00);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x815d70);
  local_2c0 = (Vector *)0x0;
  while (pVVar10 = local_2c0,
        pVVar6 = (Vector *)
                 std::vector<int,_std::allocator<int>_>::size
                           ((vector<int,_std::allocator<int>_> *)(local_1e0 + 0x178)),
        pVVar10 < pVVar6) {
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_1e0 + 0x178),
                        (size_type)local_2c0);
    local_2c4 = *pvVar7;
    in_stack_fffffffffffffbef =
         Basis::IsBasic(in_stack_fffffffffffffb10,(Int)((ulong)in_stack_fffffffffffffb08 >> 0x20));
    if ((bool)in_stack_fffffffffffffbef) {
      in_stack_fffffffffffffbe0 =
           (vector<int,_std::allocator<int>_> *)
           std::valarray<double>::operator[](local_28,(long)local_2c4);
      piVar1 = (in_stack_fffffffffffffbe0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (((double)piVar1 != 0.0) || (NAN((double)piVar1))) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb20,
                   in_stack_fffffffffffffb18);
      }
    }
    local_2c0 = (Vector *)((long)&local_2c0->_M_size + 1);
  }
  pVVar6 = (Vector *)local_1e0;
  Textline<char[32]>((char (*) [32])in_stack_fffffffffffffca8);
  poVar5 = std::operator<<((ostream *)pVVar6,local_2e8);
  sVar8 = std::vector<int,_std::allocator<int>_>::size(&local_2b8);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar8);
  std::operator<<(poVar5,'\n');
  std::__cxx11::string::~string(local_2e8);
  Control::hLog(this_00,(stringstream *)basis_00);
  d = in_stack_00000008;
  PushDual((Crossover *)this_00,basis_00,pVVar10,
           (Vector *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
           in_stack_fffffffffffffbe0,pVVar6,info_00);
  if (*(int *)((long)in_stack_00000008 + 8) == 1) {
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x8160a7);
    for (local_310 = std::vector<int,_std::allocator<int>_>::size
                               ((vector<int,_std::allocator<int>_> *)(local_1e0 + 0x178));
        local_310 != 0; local_310 = local_310 - 1) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_1e0 + 0x178),local_310 - 1);
      local_314 = *pvVar7;
      bVar3 = Basis::IsNonbasic(in_stack_fffffffffffffb10,(Int)((ulong)d >> 0x20));
      if (bVar3) {
        pdVar9 = std::valarray<double>::operator[](local_18,(long)local_314);
        dVar2 = *pdVar9;
        pdVar9 = std::valarray<double>::operator[](local_48,(long)local_314);
        if ((dVar2 != *pdVar9) || (NAN(dVar2) || NAN(*pdVar9))) {
          pdVar9 = std::valarray<double>::operator[](local_18,(long)local_314);
          dVar2 = *pdVar9;
          pdVar9 = std::valarray<double>::operator[](local_50,(long)local_314);
          if ((dVar2 != *pdVar9) || (NAN(dVar2) || NAN(*pdVar9))) {
            pdVar9 = std::valarray<double>::operator[](local_48,(long)local_314);
            uVar4 = std::isinf(*pdVar9);
            if ((uVar4 & 1) != 0) {
              pdVar9 = std::valarray<double>::operator[](local_50,(long)local_314);
              uVar4 = std::isinf(*pdVar9);
              if ((uVar4 & 1) != 0) {
                pdVar9 = std::valarray<double>::operator[](local_18,(long)local_314);
                if ((*pdVar9 == 0.0) && (!NAN(*pdVar9))) goto LAB_008162d9;
              }
            }
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb20,
                       in_stack_fffffffffffffb18);
          }
        }
      }
LAB_008162d9:
    }
    model_01 = (Model *)local_1e0;
    Textline<char[34]>((char (*) [34])in_stack_fffffffffffffca8);
    pVVar10 = (Vector *)std::operator<<((ostream *)model_01,local_338);
    sVar8 = std::vector<int,_std::allocator<int>_>::size(&local_308);
    model_00 = (Model *)std::ostream::operator<<(pVVar10,sVar8);
    std::operator<<((ostream *)model_00,'\n');
    std::__cxx11::string::~string(local_338);
    Control::hLog(this_00,(stringstream *)basis_00);
    PushPrimal(in_stack_00000220,in_stack_00000218,in_stack_00000210,in_stack_00000208,
               (bool *)primal_superbasics.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,
               (Info *)primal_superbasics.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    bVar3 = *(int *)((long)in_stack_00000008 + 8) == 1;
    if (bVar3) {
      pVVar6 = (Vector *)Control::Debug((Control *)*in_RDI,1);
      Textline<char[34]>((char (*) [34])in_stack_fffffffffffffca8);
      poVar5 = std::operator<<((ostream *)pVVar6,(string *)&stack0xfffffffffffffca8);
      PrimalResidual(model_00,pVVar6);
      sci2_abi_cxx11_(d);
      poVar5 = std::operator<<(poVar5,local_378);
      poVar5 = std::operator<<(poVar5,'\n');
      Textline<char[32]>((char (*) [32])in_stack_fffffffffffffca8);
      in_stack_fffffffffffffb20 = std::operator<<(poVar5,local_398);
      DualResidual(model_01,pVVar10,(Vector *)model_00);
      sci2_abi_cxx11_(d);
      poVar5 = std::operator<<(in_stack_fffffffffffffb20,local_3b8);
      std::operator<<(poVar5,'\n');
      std::__cxx11::string::~string(local_3b8);
      std::__cxx11::string::~string(local_398);
      std::__cxx11::string::~string(local_378);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffca8);
      *(undefined4 *)((long)in_stack_00000008 + 8) = 1;
    }
    local_2ec = (uint)!bVar3;
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb20);
  }
  else {
    local_2ec = 1;
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb20);
  std::__cxx11::stringstream::~stringstream(local_1f0);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb20);
  return;
}

Assistant:

void Crossover::PushAll(Basis* basis, Vector& x, Vector& y, Vector& z,
                        const double* weights, Info* info) {
    const Model& model = basis->model();
    const Int m = model.rows();
    const Int n = model.cols();
    const Vector& lb = model.lb();
    const Vector& ub = model.ub();
    std::vector<Int> perm = Sortperm(n+m, weights, false);

    std::stringstream h_logging_stream;
    h_logging_stream.str(std::string());
    h_logging_stream
      << Textline("Primal residual before push phase:")
      << sci2(PrimalResidual(model, x)) << '\n'
      << Textline("Dual residual before push phase:")
      << sci2(DualResidual(model, y, z)) << '\n';
    control_.hLog(h_logging_stream);

    // Run dual push phase.
    std::vector<Int> dual_superbasics;
    for (size_t p = 0; p < perm.size(); p++) {
        Int j = perm[p];
        if (basis->IsBasic(j) && z[j] != 0.0)
            dual_superbasics.push_back(j);
    }
    h_logging_stream
        << Textline("Number of dual pushes required:")
        << dual_superbasics.size() << '\n';
	control_.hLog(h_logging_stream);
    PushDual(basis, y, z, dual_superbasics, x, info);
    assert(DualInfeasibility(model, x, z) == 0.0);
    if (info->status_crossover != IPX_STATUS_optimal)
        return;

    // Run primal push phase. Because z[j]==0 for all basic variables, none of
    // the primal variables is fixed at its bound.
    std::vector<Int> primal_superbasics;
    for (size_t p = perm.size(); p > 0; p--) {
        Int j = perm[p - 1];
        if (basis->IsNonbasic(j) && x[j] != lb[j] && x[j] != ub[j] &&
            !(std::isinf(lb[j]) && std::isinf(ub[j]) && x[j] == 0.0))
            primal_superbasics.push_back(j);
    }
    h_logging_stream
        << Textline("Number of primal pushes required:")
        << primal_superbasics.size() << '\n';
	control_.hLog(h_logging_stream);
    PushPrimal(basis, x, primal_superbasics, nullptr, info);
    assert(PrimalInfeasibility(model, x) == 0.0);
    if (info->status_crossover != IPX_STATUS_optimal)
        return;

    control_.Debug()
        << Textline("Primal residual after push phase:")
        << sci2(PrimalResidual(model, x)) << '\n'
        << Textline("Dual residual after push phase:")
        << sci2(DualResidual(model, y, z)) << '\n';
    info->status_crossover = IPX_STATUS_optimal;
}